

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask9_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  long unaff_RBP;
  undefined1 auVar7 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar8 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x7060544438281c0c));
  vpmovsxbd_avx2(ZEXT816(0x68584c3c30201404));
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[0x19] * 2)));
  auVar7 = auVar8._0_16_;
  auVar6 = vpsrlvd_avx2(auVar7,_DAT_0019da90);
  auVar9 = vpgatherdd_avx512vl(*in);
  auVar11 = vpsllvd_avx2(auVar9,_DAT_00198bc0);
  auVar4 = vpinsrd_avx(auVar7,in[4] << 4,0);
  auVar4 = vpinsrd_avx(auVar4,in[0xb] << 3,2);
  auVar4 = vpor_avx(auVar4,auVar6);
  auVar6 = vpsrlvd_avx2(auVar7,_DAT_0019daa0);
  auVar4 = vpblendd_avx2(auVar4,auVar6,10);
  auVar5 = vpsllvd_avx2(auVar8,_DAT_00198c20);
  auVar9 = valignd_avx512vl(ZEXT1632(auVar4),ZEXT1632(auVar4),7);
  auVar9 = vpblendd_avx2(auVar9,ZEXT432(*in),1);
  auVar10 = vpbroadcastd_avx512vl();
  uVar1 = in[0x1d];
  auVar9 = vpblendd_avx2(auVar9,auVar10,0x20);
  auVar10 = vpbroadcastd_avx512vl();
  uVar2 = in[0x1e];
  auVar9 = vpblendd_avx2(auVar9,auVar10,0x40);
  auVar10 = vpbroadcastd_avx512vl();
  auVar9 = vpblendd_avx2(auVar9,auVar10,0x80);
  vpmovsxbd_avx2(ZEXT816(0x6c5c504034241808));
  auVar9 = vpor_avx2(auVar11,auVar9);
  uVar3 = in[0x1f];
  auVar11 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar11 = vpsllvd_avx2(auVar11,_DAT_00198c00);
  auVar9 = vpternlogd_avx512vl(auVar5,auVar11,auVar9,0xfe);
  *(undefined1 (*) [32])out = auVar9;
  out[8] = uVar3 << 0x17 | uVar2 << 0xe | uVar1 << 5 | auVar8._28_4_ >> 4;
  return out + 9;
}

Assistant:

uint32_t *__fastpackwithoutmask9_32(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (9 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (9 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (9 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (9 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (9 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (9 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (9 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (9 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  ++in;

  return out;
}